

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

Gia_Man_t * Gia_ManDupDfs(Gia_Man_t *p)

{
  uint uVar1;
  int iLit0;
  Gia_Man_t *p_00;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Abc_Cex_t *pAVar4;
  int iVar5;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar2 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar2;
  pcVar2 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar2;
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  for (iVar5 = 0; iVar5 < p->vCis->nSize; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManCi(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    uVar1 = Gia_ManAppendCi(p_00);
    pGVar3->Value = uVar1;
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManCo(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    Gia_ManDupDfs_rec(p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
  }
  for (iVar5 = 0; iVar5 < p->vCos->nSize; iVar5 = iVar5 + 1) {
    pGVar3 = Gia_ManCo(p,iVar5);
    if (pGVar3 == (Gia_Obj_t *)0x0) break;
    iLit0 = Gia_ObjFanin0Copy(pGVar3);
    uVar1 = Gia_ManAppendCo(p_00,iLit0);
    pGVar3->Value = uVar1;
  }
  Gia_ManSetRegNum(p_00,p->nRegs);
  p_00->nConstrs = p->nConstrs;
  if (p->pCexSeq != (Abc_Cex_t *)0x0) {
    pAVar4 = Abc_CexDup(p->pCexSeq,p->nRegs);
    p_00->pCexSeq = pAVar4;
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupDfs_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    if ( p->pCexSeq )
        pNew->pCexSeq = Abc_CexDup( p->pCexSeq, Gia_ManRegNum(p) );
    return pNew;
}